

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

int __thiscall
S2Builder::EdgeChainSimplifier::input_edge_layer(EdgeChainSimplifier *this,InputEdgeId id)

{
  ostream *poVar1;
  difference_type dVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  int *local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48 [3];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  InputEdgeId local_14;
  EdgeChainSimplifier *pEStack_10;
  InputEdgeId id_local;
  EdgeChainSimplifier *this_local;
  
  local_29 = 0;
  local_14 = id;
  pEStack_10 = this;
  if (id < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x5a8,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (id) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this->layer_begins_);
  local_58 = (int *)std::vector<int,_std::allocator<int>_>::end(this->layer_begins_);
  local_48[0] = std::
                upper_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                          (local_50,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )local_58,&local_14);
  local_68._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this->layer_begins_);
  local_60 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator+(&local_68,1);
  dVar2 = __gnu_cxx::operator-(local_48,&local_60);
  return (int)dVar2;
}

Assistant:

int S2Builder::EdgeChainSimplifier::input_edge_layer(InputEdgeId id) const {
  // NOTE(ericv): If this method shows up in profiling, the result could be
  // stored with each edge (i.e., edge_layers_ and new_edge_layers_).
  S2_DCHECK_GE(id, 0);
  return (std::upper_bound(layer_begins_.begin(), layer_begins_.end(), id) -
          (layer_begins_.begin() + 1));
}